

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

void __thiscall CTcSymObjBase::build_dictionary(CTcSymObjBase *this)

{
  long in_RDI;
  tc_obj_id unaff_retaddr;
  CTcVocabEntry *entry;
  char *in_stack_00000018;
  CTcDictEntry *in_stack_00000020;
  CTcSymObjBase *in_stack_fffffffffffffff0;
  long lVar1;
  long lVar2;
  
  if ((*(long *)(in_RDI + 0x60) != 0) && ((*(ushort *)(in_RDI + 0xb8) >> 5 & 1) == 0)) {
    lVar2 = in_RDI;
    inherit_vocab(in_stack_fffffffffffffff0);
    for (lVar1 = *(long *)(in_RDI + 0x68); lVar1 != 0; lVar1 = *(long *)(lVar1 + 0x18)) {
      CTcDictEntry::add_word
                (in_stack_00000020,in_stack_00000018,(size_t)this,entry._4_4_,unaff_retaddr,
                 (tc_prop_id)((ulong)lVar2 >> 0x20));
    }
  }
  return;
}

Assistant:

void CTcSymObjBase::build_dictionary()
{
    CTcVocabEntry *entry;

    /* if I don't have a dictionary, there's nothing to do */
    if (dict_ == 0)
        return;

    /* 
     *   if I'm a class, there's nothing to do, since vocabulary defined in a
     *   class is only entered in the dictionary for the instances of the
     *   class, not for the class itself 
     */
    if (is_class_)
        return;

    /* add inherited words from my superclasses to my list */
    inherit_vocab();

    /* add each of my words to the dictionary */
    for (entry = vocab_ ; entry != 0 ; entry = entry->nxt_)
    {
        /* add this word to my dictionary */
        dict_->add_word(entry->txt_, entry->len_, FALSE,
                        obj_id_, entry->prop_);
    }
}